

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_merge_r(lyd_node *src_diff,lyd_node *diff_parent,lyd_diff_cb diff_cb,void *cb_data,
                       ly_ht **dup_inst,uint16_t options,lyd_node **diff)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  ly_ctx *local_c0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  lyd_node *local_90;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_ht *child_dup_inst;
  lyd_diff_op cur_op;
  lyd_diff_op src_op;
  lyd_node *diff_node;
  lyd_node *child;
  LY_ERR ret;
  uint16_t options_local;
  ly_ht **dup_inst_local;
  void *cb_data_local;
  lyd_diff_cb diff_cb_local;
  lyd_node *diff_parent_local;
  lyd_node *src_diff_local;
  
  child._0_4_ = LY_SUCCESS;
  _cur_op = (lyd_node *)0x0;
  _ret___1 = (ly_ht *)0x0;
  child._6_2_ = options;
  _ret = dup_inst;
  dup_inst_local = (ly_ht **)cb_data;
  cb_data_local = diff_cb;
  diff_cb_local = (lyd_diff_cb)diff_parent;
  diff_parent_local = src_diff;
  LVar1 = lyd_diff_get_op(src_diff,(lyd_diff_op *)((long)&child_dup_inst + 4));
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (diff_cb_local == (lyd_diff_cb)0x0) {
    local_90 = *diff;
  }
  else {
    local_90 = lyd_child_no_keys((lyd_node *)diff_cb_local);
  }
  LVar1 = lyd_diff_find_match(local_90,diff_parent_local,'\x01',_ret,(lyd_node **)&cur_op);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (_cur_op == (lyd_node *)0x0) {
LAB_0011d6df:
    if (((diff_parent_local->flags & 8) == 0) || (diff_cb_local == (lyd_diff_cb)0x0)) {
      LVar1 = lyd_dup_single(diff_parent_local,(lyd_node_inner *)diff_cb_local,0x49,
                             (lyd_node **)&cur_op);
    }
    else {
      if (*(long *)(diff_cb_local + 8) == 0) {
        local_c0 = *(ly_ctx **)(diff_cb_local + 0x78);
      }
      else {
        local_c0 = (ly_ctx *)**(undefined8 **)(*(long *)(diff_cb_local + 8) + 8);
      }
      LVar1 = lyd_dup_single_to_ctx
                        (diff_parent_local,local_c0,(lyd_node_inner *)diff_cb_local,0x49,
                         (lyd_node **)&cur_op);
    }
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (diff_cb_local == (lyd_diff_cb)0x0) {
      lyd_diff_insert_sibling(*diff,_cur_op,diff);
    }
    LVar1 = lyd_diff_change_op(_cur_op,child_dup_inst._4_4_);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if ((cb_data_local != (void *)0x0) &&
       (LVar1 = (*(code *)cb_data_local)(0,_cur_op,dup_inst_local), LVar1 != LY_SUCCESS)) {
      return LVar1;
    }
    diff_cb_local = (lyd_diff_cb)_cur_op;
  }
  else {
    LVar1 = lyd_diff_get_op(_cur_op,(lyd_diff_op *)&child_dup_inst);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    switch(child_dup_inst._4_4_) {
    case LYD_DIFF_OP_CREATE:
      if ((((lyd_diff_op)child_dup_inst == LYD_DIFF_OP_CREATE) &&
          (_cur_op->schema != (lysc_node *)0x0)) &&
         (((_cur_op->schema->nodetype == 0x10 && ((_cur_op->schema->flags & 0x200) != 0)) ||
          ((_cur_op->schema->nodetype == 8 && ((_cur_op->schema->flags & 1) == 0))))))
      goto LAB_0011d6df;
      child._0_4_ = lyd_diff_merge_create
                              ((lyd_node **)&cur_op,diff,(lyd_diff_op)child_dup_inst,
                               diff_parent_local,child._6_2_);
      break;
    case LYD_DIFF_OP_DELETE:
      child._0_4_ = lyd_diff_merge_delete(_cur_op,(lyd_diff_op)child_dup_inst,diff_parent_local);
      break;
    case LYD_DIFF_OP_REPLACE:
      child._0_4_ = lyd_diff_merge_replace(_cur_op,(lyd_diff_op)child_dup_inst,diff_parent_local);
      break;
    case LYD_DIFF_OP_NONE:
      if (((diff_parent_local->schema->nodetype == 0x10) &&
          (diff_parent_local->schema != (lysc_node *)0x0)) &&
         (((diff_parent_local->schema->nodetype == 0x10 &&
           ((diff_parent_local->schema->flags & 0x200) != 0)) ||
          ((diff_parent_local->schema->nodetype == 8 &&
           ((diff_parent_local->schema->flags & 1) == 0)))))) {
        __assert_fail("(src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x7cb,
                      "LY_ERR lyd_diff_merge_r(const struct lyd_node *, struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **, uint16_t, struct lyd_node **)"
                     );
      }
      child._0_4_ = lyd_diff_merge_none(_cur_op,(lyd_diff_op)child_dup_inst,diff_parent_local);
      break;
    default:
      if (diff_parent_local->schema == (lysc_node *)0x0) {
        local_a0 = (ly_ctx *)diff_parent_local[2].schema;
      }
      else {
        local_a0 = diff_parent_local->schema->module->ctx;
      }
      ly_log(local_a0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",1999);
      return LY_EINT;
    }
    if ((LY_ERR)child != LY_SUCCESS) {
      if (diff_parent_local->schema == (lysc_node *)0x0) {
        local_a8 = (ly_ctx *)diff_parent_local[2].schema;
      }
      else {
        local_a8 = diff_parent_local->schema->module->ctx;
      }
      pcVar3 = lyd_diff_op2str(child_dup_inst._4_4_);
      ly_log(local_a8,LY_LLERR,LY_EOTHER,"Merging operation \"%s\" failed.",pcVar3);
      return (LY_ERR)child;
    }
    if ((cb_data_local != (void *)0x0) &&
       (LVar1 = (*(code *)cb_data_local)(diff_parent_local,_cur_op,dup_inst_local),
       LVar1 != LY_SUCCESS)) {
      return LVar1;
    }
    diff_cb_local = (lyd_diff_cb)_cur_op;
    if ((diff_parent_local->schema == (lysc_node *)0x0) ||
       (((diff_parent_local->schema->nodetype != 0x10 ||
         ((diff_parent_local->schema->flags & 0x200) == 0)) &&
        ((diff_parent_local->schema->nodetype != 8 || ((diff_parent_local->schema->flags & 1) != 0))
        )))) {
      diff_node = lyd_child_no_keys(diff_parent_local);
      while ((diff_node != (lyd_node *)0x0 &&
             (child._0_4_ = lyd_diff_merge_r(diff_node,(lyd_node *)diff_cb_local,
                                             (lyd_diff_cb)cb_data_local,dup_inst_local,
                                             (ly_ht **)&ret___1,child._6_2_,diff),
             (LY_ERR)child == LY_SUCCESS))) {
        diff_node = diff_node->next;
      }
      lyd_dup_inst_free(_ret___1);
      if ((LY_ERR)child != LY_SUCCESS) {
        return (LY_ERR)child;
      }
    }
  }
  iVar2 = lyd_diff_is_redundant((lyd_node *)diff_cb_local);
  if (iVar2 != 0) {
    if ((lyd_node *)diff_cb_local == *diff) {
      *diff = (*diff)->next;
    }
    lyd_free_tree((lyd_node *)diff_cb_local);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_diff_merge_r(const struct lyd_node *src_diff, struct lyd_node *diff_parent, lyd_diff_cb diff_cb, void *cb_data,
        struct ly_ht **dup_inst, uint16_t options, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node *child, *diff_node = NULL;
    enum lyd_diff_op src_op, cur_op;
    struct ly_ht *child_dup_inst = NULL;

    /* get source node operation */
    LY_CHECK_RET(lyd_diff_get_op(src_diff, &src_op));

    /* find an equal node in the current diff */
    LY_CHECK_RET(lyd_diff_find_match(diff_parent ? lyd_child_no_keys(diff_parent) : *diff, src_diff, 1, dup_inst, &diff_node));

    if (diff_node) {
        /* get target (current) operation */
        LY_CHECK_RET(lyd_diff_get_op(diff_node, &cur_op));

        /* merge operations */
        switch (src_op) {
        case LYD_DIFF_OP_REPLACE:
            ret = lyd_diff_merge_replace(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_CREATE:
            if ((cur_op == LYD_DIFF_OP_CREATE) && lysc_is_dup_inst_list(diff_node->schema)) {
                /* special case of creating duplicate (leaf-)list instances */
                goto add_diff;
            }

            ret = lyd_diff_merge_create(&diff_node, diff, cur_op, src_diff, options);
            break;
        case LYD_DIFF_OP_DELETE:
            ret = lyd_diff_merge_delete(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_NONE:
            /* key-less list can never have "none" operation since all its descendants are acting as "keys" */
            assert((src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema));
            ret = lyd_diff_merge_none(diff_node, cur_op, src_diff);
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        if (ret) {
            LOGERR(LYD_CTX(src_diff), LY_EOTHER, "Merging operation \"%s\" failed.", lyd_diff_op2str(src_op));
            return ret;
        }

        if (diff_cb) {
            /* call callback */
            LY_CHECK_RET(diff_cb(src_diff, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;

        /* for diff purposes, all key-less list descendants actually act as keys (identifying the same instances),
         * so there is nothing to merge for these "keys" */
        if (!lysc_is_dup_inst_list(src_diff->schema)) {
            /* merge src_diff recursively */
            LY_LIST_FOR(lyd_child_no_keys(src_diff), child) {
                ret = lyd_diff_merge_r(child, diff_parent, diff_cb, cb_data, &child_dup_inst, options, diff);
                if (ret) {
                    break;
                }
            }
            lyd_dup_inst_free(child_dup_inst);
            LY_CHECK_RET(ret);
        }
    } else {
add_diff:
        /* add new diff node with all descendants */
        if ((src_diff->flags & LYD_EXT) && diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(src_diff, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        } else {
            LY_CHECK_RET(lyd_dup_single(src_diff, (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        }

        /* insert node into diff if not already */
        if (!diff_parent) {
            lyd_diff_insert_sibling(*diff, diff_node, diff);
        }

        /* update operation */
        LY_CHECK_RET(lyd_diff_change_op(diff_node, src_op));

        if (diff_cb) {
            /* call callback with no source diff node since it was duplicated and just added */
            LY_CHECK_RET(diff_cb(NULL, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;
    }

    /* remove any redundant nodes */
    if (lyd_diff_is_redundant(diff_parent)) {
        if (diff_parent == *diff) {
            *diff = (*diff)->next;
        }
        lyd_free_tree(diff_parent);
    }

    return LY_SUCCESS;
}